

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ta.cc
# Opt level: O3

state_status_t
tchecker::ta::prev(system_t *system,vloc_sptr_t *vloc,intval_sptr_t *intval,vedge_sptr_t *vedge,
                  sync_id_t *sync_id,clock_constraint_container_t *src_invariant,
                  clock_constraint_container_t *guard,clock_reset_container_t *reset,
                  clock_constraint_container_t *tgt_invariant,incoming_edges_value_t *v)

{
  undefined4 *puVar1;
  ushort uVar2;
  make_shared_t<tchecker::vloc_t,_unsigned_long,_1UL> *pmVar3;
  iterator iVar4;
  integer_iterator_t<int> *piVar5;
  make_shared_t<tchecker::intval_t,_unsigned_long,_1UL> *pmVar6;
  bool bVar7;
  state_status_t sVar8;
  char *pcVar9;
  type *__range2;
  ulong uVar10;
  long lVar11;
  ulong uVar12;
  ulong uVar13;
  vector<unsigned_int,_std::allocator<unsigned_int>_> vloc_src;
  vector<int,_std::allocator<int>_> intval_src;
  vector<int,_std::allocator<int>_> intval_tgt;
  vector<unsigned_int,_std::allocator<unsigned_int>_> vloc_tgt;
  uint *local_40;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_38;
  
  if (vloc->_t == (make_shared_t<tchecker::vloc_t,_unsigned_long,_1UL> *)0x0) {
LAB_0019555e:
    pcVar9 = 
    "T *tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::vloc_t>>::operator->() const [T = tchecker::make_shared_t<tchecker::vloc_t>]"
    ;
LAB_0019558c:
    __assert_fail("_t != nullptr",
                  "/workspace/llm4binary/github/license_c_cmakelists/ticktac-project[P]tchecker/src/../include/tchecker/utils/shared_objects.hh"
                  ,0x1db,pcVar9);
  }
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (&vloc_tgt,
             (ulong)(vloc->_t->super_vloc_t).super_loc_array_t.super_vloc_base_t.
                    super_array_capacity_t<unsigned_int>._capacity,(allocator_type *)&vloc_src);
  if ((EVP_PKEY_CTX *)vloc->_t == (EVP_PKEY_CTX *)0x0) {
LAB_001954f7:
    pcVar9 = 
    "T &tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::vloc_t>>::operator*() const [T = tchecker::make_shared_t<tchecker::vloc_t>]"
    ;
    goto LAB_0019550c;
  }
  copy((ta *)vloc_tgt.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_start,
       (EVP_PKEY_CTX *)
       vloc_tgt.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_finish,(EVP_PKEY_CTX *)vloc->_t);
  if (intval->_t == (make_shared_t<tchecker::intval_t,_unsigned_long,_1UL> *)0x0) {
LAB_00195577:
    pcVar9 = 
    "T *tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::intval_t>>::operator->() const [T = tchecker::make_shared_t<tchecker::intval_t>]"
    ;
    goto LAB_0019558c;
  }
  std::vector<int,_std::allocator<int>_>::vector
            (&intval_tgt,
             (ulong)(intval->_t->super_intval_t).super_integer_array_t.super_intval_base_t.
                    super_array_capacity_t<unsigned_short>._capacity,(allocator_type *)&vloc_src);
  if ((EVP_PKEY_CTX *)intval->_t != (EVP_PKEY_CTX *)0x0) {
    copy((ta *)intval_tgt.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start,
         (EVP_PKEY_CTX *)
         intval_tgt.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
         _M_finish,(EVP_PKEY_CTX *)intval->_t);
    vloc_src.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_start =
         &((v->
           super__Tuple_impl<0UL,_tchecker::syncprod::vloc_edges_iterator_t::sync_edges_t,_tchecker::range_t<tchecker::cartesian_iterator_t<tchecker::range_t<tchecker::integer_iterator_t<int>,_tchecker::integer_iterator_t<int>_>_>::values_iterator_t,_tchecker::cartesian_iterator_t<tchecker::range_t<tchecker::integer_iterator_t<int>,_tchecker::integer_iterator_t<int>_>_>::values_iterator_t>_>
           ).super__Head_base<0UL,_tchecker::syncprod::vloc_edges_iterator_t::sync_edges_t,_false>.
           _M_head_impl.edges._begin._async_edge.
           super___shared_ptr<const_tchecker::system::edge_t,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
          _pid;
    vloc_src.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish =
         (pointer)((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                  ((long)&(v->
                          super__Tuple_impl<0UL,_tchecker::syncprod::vloc_edges_iterator_t::sync_edges_t,_tchecker::range_t<tchecker::cartesian_iterator_t<tchecker::range_t<tchecker::integer_iterator_t<int>,_tchecker::integer_iterator_t<int>_>_>::values_iterator_t,_tchecker::cartesian_iterator_t<tchecker::range_t<tchecker::integer_iterator_t<int>,_tchecker::integer_iterator_t<int>_>_>::values_iterator_t>_>
                          ).
                          super__Head_base<0UL,_tchecker::syncprod::vloc_edges_iterator_t::sync_edges_t,_false>
                          ._M_head_impl.edges._begin._async_edge.
                          super___shared_ptr<const_tchecker::system::edge_t,_(__gnu_cxx::_Lock_policy)2>
                  + 8))->_M_pi;
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
        vloc_src.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_finish != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
        vloc_src.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_finish)->_M_use_count =
             ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
             vloc_src.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_finish)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
        vloc_src.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_finish)->_M_use_count =
             ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
             vloc_src.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_finish)->_M_use_count + 1;
      }
    }
    vloc_src.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         *(pointer *)
          &(v->
           super__Tuple_impl<0UL,_tchecker::syncprod::vloc_edges_iterator_t::sync_edges_t,_tchecker::range_t<tchecker::cartesian_iterator_t<tchecker::range_t<tchecker::integer_iterator_t<int>,_tchecker::integer_iterator_t<int>_>_>::values_iterator_t,_tchecker::cartesian_iterator_t<tchecker::range_t<tchecker::integer_iterator_t<int>,_tchecker::integer_iterator_t<int>_>_>::values_iterator_t>_>
           ).super__Head_base<0UL,_tchecker::syncprod::vloc_edges_iterator_t::sync_edges_t,_false>.
           _M_head_impl.edges._begin._async_at_end;
    intval_src.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)(v->
                        super__Tuple_impl<0UL,_tchecker::syncprod::vloc_edges_iterator_t::sync_edges_t,_tchecker::range_t<tchecker::cartesian_iterator_t<tchecker::range_t<tchecker::integer_iterator_t<int>,_tchecker::integer_iterator_t<int>_>_>::values_iterator_t,_tchecker::cartesian_iterator_t<tchecker::range_t<tchecker::integer_iterator_t<int>,_tchecker::integer_iterator_t<int>_>_>::values_iterator_t>_>
                        ).
                        super__Head_base<0UL,_tchecker::syncprod::vloc_edges_iterator_t::sync_edges_t,_false>
                        ._M_head_impl.edges._end._async_edge.
                        super___shared_ptr<const_tchecker::system::edge_t,_(__gnu_cxx::_Lock_policy)2>
                        ._M_ptr;
    intval_src.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                         ((long)&(v->
                                 super__Tuple_impl<0UL,_tchecker::syncprod::vloc_edges_iterator_t::sync_edges_t,_tchecker::range_t<tchecker::cartesian_iterator_t<tchecker::range_t<tchecker::integer_iterator_t<int>,_tchecker::integer_iterator_t<int>_>_>::values_iterator_t,_tchecker::cartesian_iterator_t<tchecker::range_t<tchecker::integer_iterator_t<int>,_tchecker::integer_iterator_t<int>_>_>::values_iterator_t>_>
                                 ).
                                 super__Head_base<0UL,_tchecker::syncprod::vloc_edges_iterator_t::sync_edges_t,_false>
                                 ._M_head_impl.edges._end._async_edge.
                                 super___shared_ptr<const_tchecker::system::edge_t,_(__gnu_cxx::_Lock_policy)2>
                         + 8))->_M_pi;
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
        intval_src.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_finish != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
        intval_src.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_finish)->_M_use_count =
             ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
             intval_src.super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_finish)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
        intval_src.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_finish)->_M_use_count =
             ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
             intval_src.super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_finish)->_M_use_count + 1;
      }
    }
    intval_src.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage =
         *(pointer *)
          &(v->
           super__Tuple_impl<0UL,_tchecker::syncprod::vloc_edges_iterator_t::sync_edges_t,_tchecker::range_t<tchecker::cartesian_iterator_t<tchecker::range_t<tchecker::integer_iterator_t<int>,_tchecker::integer_iterator_t<int>_>_>::values_iterator_t,_tchecker::cartesian_iterator_t<tchecker::range_t<tchecker::integer_iterator_t<int>,_tchecker::integer_iterator_t<int>_>_>::values_iterator_t>_>
           ).super__Head_base<0UL,_tchecker::syncprod::vloc_edges_iterator_t::sync_edges_t,_false>.
           _M_head_impl.edges._end._async_at_end;
    while (bVar7 = syncprod::edges_iterator_t::operator!=
                             ((edges_iterator_t *)&vloc_src,(edges_iterator_t *)&intval_src), bVar7)
    {
      syncprod::edges_iterator_t::operator*((edges_iterator_t *)&vloc_src);
      pmVar3 = vloc->_t;
      if (pmVar3 == (make_shared_t<tchecker::vloc_t,_unsigned_long,_1UL> *)0x0) goto LAB_001954f7;
      if ((pmVar3->super_vloc_t).super_loc_array_t.super_vloc_base_t.
          super_array_capacity_t<unsigned_int>._capacity <= *local_40) {
        pcVar9 = 
        "T &tchecker::make_array_t<unsigned int, 4, tchecker::vloc_base_t>::operator[](typename BASE::capacity_t) [T = unsigned int, T_ALLOCSIZE = 4, BASE = tchecker::vloc_base_t]"
        ;
        goto LAB_0019552b;
      }
      (&(pmVar3->super_vloc_t).super_loc_array_t._fam)[*local_40] =
           *(no_storage_array_t<unsigned_int> *)(local_40 + 2);
      if (local_38 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_38);
      }
      syncprod::edges_iterator_t::operator++((edges_iterator_t *)&vloc_src);
    }
    if (intval_src.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_finish != (pointer)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 intval_src.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_finish);
    }
    if (vloc_src.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_finish != (pointer)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 vloc_src.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_finish);
    }
    iVar4._M_current =
         (v->
         super__Tuple_impl<0UL,_tchecker::syncprod::vloc_edges_iterator_t::sync_edges_t,_tchecker::range_t<tchecker::cartesian_iterator_t<tchecker::range_t<tchecker::integer_iterator_t<int>,_tchecker::integer_iterator_t<int>_>_>::values_iterator_t,_tchecker::cartesian_iterator_t<tchecker::range_t<tchecker::integer_iterator_t<int>,_tchecker::integer_iterator_t<int>_>_>::values_iterator_t>_>
         ).
         super__Tuple_impl<1UL,_tchecker::range_t<tchecker::cartesian_iterator_t<tchecker::range_t<tchecker::integer_iterator_t<int>,_tchecker::integer_iterator_t<int>_>_>::values_iterator_t,_tchecker::cartesian_iterator_t<tchecker::range_t<tchecker::integer_iterator_t<int>,_tchecker::integer_iterator_t<int>_>_>::values_iterator_t>_>
         .
         super__Head_base<1UL,_tchecker::range_t<tchecker::cartesian_iterator_t<tchecker::range_t<tchecker::integer_iterator_t<int>,_tchecker::integer_iterator_t<int>_>_>::values_iterator_t,_tchecker::cartesian_iterator_t<tchecker::range_t<tchecker::integer_iterator_t<int>,_tchecker::integer_iterator_t<int>_>_>::values_iterator_t>,_false>
         ._M_head_impl._begin._it._M_current;
    piVar5 = (v->
             super__Tuple_impl<0UL,_tchecker::syncprod::vloc_edges_iterator_t::sync_edges_t,_tchecker::range_t<tchecker::cartesian_iterator_t<tchecker::range_t<tchecker::integer_iterator_t<int>,_tchecker::integer_iterator_t<int>_>_>::values_iterator_t,_tchecker::cartesian_iterator_t<tchecker::range_t<tchecker::integer_iterator_t<int>,_tchecker::integer_iterator_t<int>_>_>::values_iterator_t>_>
             ).
             super__Tuple_impl<1UL,_tchecker::range_t<tchecker::cartesian_iterator_t<tchecker::range_t<tchecker::integer_iterator_t<int>,_tchecker::integer_iterator_t<int>_>_>::values_iterator_t,_tchecker::cartesian_iterator_t<tchecker::range_t<tchecker::integer_iterator_t<int>,_tchecker::integer_iterator_t<int>_>_>::values_iterator_t>_>
             .
             super__Head_base<1UL,_tchecker::range_t<tchecker::cartesian_iterator_t<tchecker::range_t<tchecker::integer_iterator_t<int>,_tchecker::integer_iterator_t<int>_>_>::values_iterator_t,_tchecker::cartesian_iterator_t<tchecker::range_t<tchecker::integer_iterator_t<int>,_tchecker::integer_iterator_t<int>_>_>::values_iterator_t>,_false>
             ._M_head_impl._end._it._M_current;
    if (iVar4._M_current != piVar5) {
      pmVar6 = intval->_t;
      if (pmVar6 == (make_shared_t<tchecker::intval_t,_unsigned_long,_1UL> *)0x0) goto LAB_001955be;
      uVar2 = (pmVar6->super_intval_t).super_integer_array_t.super_intval_base_t.
              super_array_capacity_t<unsigned_short>._capacity;
      lVar11 = 0;
      do {
        if ((ulong)uVar2 * 4 == lVar11) goto LAB_00195516;
        puVar1 = (undefined4 *)((long)&(iVar4._M_current)->_current + lVar11);
        *(undefined4 *)(&(pmVar6->super_intval_t).super_integer_array_t._fam.field_0x0 + lVar11) =
             *puVar1;
        lVar11 = lVar11 + 4;
      } while ((integer_iterator_t<int> *)(puVar1 + 1) != piVar5);
    }
    if (vloc->_t == (make_shared_t<tchecker::vloc_t,_unsigned_long,_1UL> *)0x0) goto LAB_0019555e;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              (&vloc_src,
               (ulong)(vloc->_t->super_vloc_t).super_loc_array_t.super_vloc_base_t.
                      super_array_capacity_t<unsigned_int>._capacity,(allocator_type *)&intval_src);
    if ((EVP_PKEY_CTX *)vloc->_t == (EVP_PKEY_CTX *)0x0) goto LAB_001954f7;
    copy((ta *)vloc_src.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_start,
         (EVP_PKEY_CTX *)
         vloc_src.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
         super__Vector_impl_data._M_finish,(EVP_PKEY_CTX *)vloc->_t);
    if (intval->_t == (make_shared_t<tchecker::intval_t,_unsigned_long,_1UL> *)0x0)
    goto LAB_00195577;
    std::vector<int,_std::allocator<int>_>::vector
              (&intval_src,
               (ulong)(intval->_t->super_intval_t).super_integer_array_t.super_intval_base_t.
                      super_array_capacity_t<unsigned_short>._capacity,(allocator_type *)&local_40);
    if ((EVP_PKEY_CTX *)intval->_t != (EVP_PKEY_CTX *)0x0) {
      copy((ta *)intval_src.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start,
           (EVP_PKEY_CTX *)
           intval_src.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_finish,(EVP_PKEY_CTX *)intval->_t);
      sVar8 = next(system,vloc,intval,vedge,sync_id,src_invariant,guard,reset,tgt_invariant,
                   &(v->
                    super__Tuple_impl<0UL,_tchecker::syncprod::vloc_edges_iterator_t::sync_edges_t,_tchecker::range_t<tchecker::cartesian_iterator_t<tchecker::range_t<tchecker::integer_iterator_t<int>,_tchecker::integer_iterator_t<int>_>_>::values_iterator_t,_tchecker::cartesian_iterator_t<tchecker::range_t<tchecker::integer_iterator_t<int>,_tchecker::integer_iterator_t<int>_>_>::values_iterator_t>_>
                    ).
                    super__Head_base<0UL,_tchecker::syncprod::vloc_edges_iterator_t::sync_edges_t,_false>
                    ._M_head_impl);
      if (sVar8 != 1) goto LAB_00195471;
      pmVar3 = vloc->_t;
      if (pmVar3 == (make_shared_t<tchecker::vloc_t,_unsigned_long,_1UL> *)0x0) goto LAB_001954f7;
      uVar12 = (ulong)(pmVar3->super_vloc_t).super_loc_array_t.super_vloc_base_t.
                      super_array_capacity_t<unsigned_int>._capacity;
      if ((long)vloc_tgt.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)vloc_tgt.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_start >> 2 != uVar12) {
        __assert_fail("vloc.capacity() == copy.size()",
                      "/workspace/llm4binary/github/license_c_cmakelists/ticktac-project[P]tchecker/src/ta/ta.cc"
                      ,0xb0,
                      "bool tchecker::ta::operator!=(const tchecker::vloc_t &, const std::vector<tchecker::loc_id_t> &)"
                     );
      }
      if (uVar12 != 0) {
        sVar8 = 2;
        if ((pmVar3->super_vloc_t).super_loc_array_t._fam !=
            (no_storage_array_t<unsigned_int>)
            *vloc_tgt.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_start) goto LAB_00195471;
        uVar10 = 1;
        do {
          uVar13 = uVar10;
          if (uVar12 == uVar13) break;
          uVar10 = uVar13 + 1;
        } while ((&(pmVar3->super_vloc_t).super_loc_array_t._fam)[uVar13] ==
                 *(no_storage_array_t<unsigned_int> *)
                  (vloc_tgt.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data._M_start + uVar13));
        if (uVar13 < uVar12) goto LAB_00195471;
      }
      pmVar6 = intval->_t;
      if (pmVar6 != (make_shared_t<tchecker::intval_t,_unsigned_long,_1UL> *)0x0) {
        uVar2 = (pmVar6->super_intval_t).super_integer_array_t.super_intval_base_t.
                super_array_capacity_t<unsigned_short>._capacity;
        uVar10 = (ulong)uVar2;
        if ((long)intval_tgt.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)intval_tgt.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start >> 2 != uVar10) {
          __assert_fail("intval.capacity() == copy.size()",
                        "/workspace/llm4binary/github/license_c_cmakelists/ticktac-project[P]tchecker/src/ta/ta.cc"
                        ,0xb9,
                        "bool tchecker::ta::operator!=(const tchecker::intval_t &, const std::vector<tchecker::integer_t> &)"
                       );
        }
        if (uVar10 != 0) {
          bVar7 = true;
          uVar13 = 0;
          do {
            if (uVar2 == (ushort)uVar13) {
              __assert_fail("i < BASE::_capacity",
                            "/workspace/llm4binary/github/license_c_cmakelists/ticktac-project[P]tchecker/src/../include/tchecker/utils/array.hh"
                            ,0xfd,
                            "const T &tchecker::make_array_t<int, 4, tchecker::intval_base_t>::operator[](typename BASE::capacity_t) const [T = int, T_ALLOCSIZE = 4, BASE = tchecker::intval_base_t]"
                           );
            }
            if ((&(pmVar6->super_intval_t).super_integer_array_t._fam)[uVar13 & 0xffff] !=
                *(no_storage_array_t<int> *)
                 (intval_tgt.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start + uVar13)) break;
            uVar13 = uVar13 + 1;
            bVar7 = uVar13 < uVar10;
          } while (uVar13 != uVar10);
          sVar8 = 2;
          if (bVar7) goto LAB_00195471;
        }
        if ((long)vloc_src.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)vloc_src.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_start >> 2 != uVar12) {
          __assert_fail("vloc.capacity() == copy.size()",
                        "/workspace/llm4binary/github/license_c_cmakelists/ticktac-project[P]tchecker/src/ta/ta.cc"
                        ,0x9b,
                        "void tchecker::ta::copy(tchecker::vloc_t &, const std::vector<tchecker::loc_id_t> &)"
                       );
        }
        if (vloc_src.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_finish !=
            vloc_src.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_start) {
          lVar11 = 0;
          do {
            (&(pmVar3->super_vloc_t).super_loc_array_t._fam)[lVar11] =
                 *(no_storage_array_t<unsigned_int> *)
                  (vloc_src.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data._M_start + lVar11);
            lVar11 = lVar11 + 1;
          } while (uVar12 + (uVar12 == 0) != lVar11);
        }
        if ((long)intval_src.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)intval_src.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start >> 2 != uVar10) {
          __assert_fail("intval.capacity() == copy.size()",
                        "/workspace/llm4binary/github/license_c_cmakelists/ticktac-project[P]tchecker/src/ta/ta.cc"
                        ,0xa9,
                        "void tchecker::ta::copy(tchecker::intval_t &, const std::vector<tchecker::integer_t> &)"
                       );
        }
        sVar8 = 1;
        if (intval_src.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
            ._M_finish !=
            intval_src.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
            ._M_start) {
          uVar12 = 0;
          do {
            if (uVar10 == uVar12) {
LAB_00195516:
              pcVar9 = 
              "T &tchecker::make_array_t<int, 4, tchecker::intval_base_t>::operator[](typename BASE::capacity_t) [T = int, T_ALLOCSIZE = 4, BASE = tchecker::intval_base_t]"
              ;
LAB_0019552b:
              __assert_fail("i < BASE::_capacity",
                            "/workspace/llm4binary/github/license_c_cmakelists/ticktac-project[P]tchecker/src/../include/tchecker/utils/array.hh"
                            ,0xf1,pcVar9);
            }
            (&(pmVar6->super_intval_t).super_integer_array_t._fam)[uVar12] =
                 *(no_storage_array_t<int> *)
                  (intval_src.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start + uVar12);
            uVar12 = uVar12 + 1;
          } while (uVar10 + (uVar10 == 0) != uVar12);
        }
LAB_00195471:
        if (intval_src.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
            ._M_start != (pointer)0x0) {
          operator_delete(intval_src.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)intval_src.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_end_of_storage -
                          (long)intval_src.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_start);
        }
        if (vloc_src.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(vloc_src.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start,
                          (long)vloc_src.
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)vloc_src.
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                _M_impl.super__Vector_impl_data._M_start);
        }
        if (intval_tgt.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
            ._M_start != (pointer)0x0) {
          operator_delete(intval_tgt.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)intval_tgt.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_end_of_storage -
                          (long)intval_tgt.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_start);
        }
        if (vloc_tgt.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(vloc_tgt.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start,
                          (long)vloc_tgt.
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)vloc_tgt.
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                _M_impl.super__Vector_impl_data._M_start);
        }
        return sVar8;
      }
    }
  }
LAB_001955be:
  pcVar9 = 
  "T &tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::intval_t>>::operator*() const [T = tchecker::make_shared_t<tchecker::intval_t>]"
  ;
LAB_0019550c:
  __assert_fail("_t != nullptr",
                "/workspace/llm4binary/github/license_c_cmakelists/ticktac-project[P]tchecker/src/../include/tchecker/utils/shared_objects.hh"
                ,0x1d0,pcVar9);
}

Assistant:

tchecker::state_status_t prev(tchecker::ta::system_t const & system, tchecker::vloc_sptr_t const & vloc,
                              tchecker::intval_sptr_t const & intval, tchecker::vedge_sptr_t const & vedge,
                              tchecker::sync_id_t & sync_id, tchecker::clock_constraint_container_t & src_invariant,
                              tchecker::clock_constraint_container_t & guard, tchecker::clock_reset_container_t & reset,
                              tchecker::clock_constraint_container_t & tgt_invariant,
                              tchecker::ta::incoming_edges_value_t const & v)
{
  auto && [sync_edges, valuation] = v;

  // Make a copy of target vloc and intval
  std::vector<tchecker::loc_id_t> vloc_tgt(vloc->capacity());
  copy(vloc_tgt, *vloc);
  std::vector<tchecker::integer_t> intval_tgt(intval->capacity());
  copy(intval_tgt, *intval);

  // Update vloc and intval to source according to v
  for (tchecker::system::edge_const_shared_ptr_t const & e : sync_edges.edges)
    (*vloc)[e->pid()] = e->src();
  tchecker::intvar_id_t id = 0;
  for (tchecker::integer_t i : valuation) {
    (*intval)[id] = i;
    ++id;
  }

  // Make a copy of source vloc and intval
  std::vector<tchecker::loc_id_t> vloc_src(vloc->capacity());
  copy(vloc_src, *vloc);
  std::vector<tchecker::integer_t> intval_src(intval->capacity());
  copy(intval_src, *intval);

  // Apply transition forward to check enabledness and target state
  tchecker::state_status_t status =
      tchecker::ta::next(system, vloc, intval, vedge, sync_id, src_invariant, guard, reset, tgt_invariant, sync_edges);
  if (status != tchecker::STATE_OK)
    return status;

  // Check target vloc and intval are matched
  if (*vloc != vloc_tgt || *intval != intval_tgt)
    return tchecker::STATE_INCOMPATIBLE_EDGE;

  // Update to source vloc and intval
  copy(*vloc, vloc_src);
  copy(*intval, intval_src);
  return tchecker::STATE_OK;
}